

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erarules.cpp
# Opt level: O0

int32_t __thiscall icu_63::EraRules::getStartYear(EraRules *this,int32_t eraIdx,UErrorCode *status)

{
  UBool UVar1;
  int *piVar2;
  int32_t local_38 [2];
  int fields [3];
  int year;
  UErrorCode *status_local;
  int32_t eraIdx_local;
  EraRules *this_local;
  
  fields[1] = 0x7fffffff;
  unique0x1000005d = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((eraIdx < 0) || (this->numEras <= eraIdx)) {
      *stack0xffffffffffffffd8 = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = fields[1];
    }
    else {
      piVar2 = LocalMemory<int>::operator[](&this->startDates,(long)eraIdx);
      decodeDate(*piVar2,(int32_t (*) [3])local_38);
      this_local._4_4_ = local_38[0];
    }
  }
  else {
    this_local._4_4_ = fields[1];
  }
  return this_local._4_4_;
}

Assistant:

int32_t EraRules::getStartYear(int32_t eraIdx, UErrorCode& status) const {
    int year = MAX_INT32;   // bogus value
    if(U_FAILURE(status)) {
        return year;
    }
    if (eraIdx < 0 || eraIdx >= numEras) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return year;
    }
    int fields[3];
    decodeDate(startDates[eraIdx], fields);
    year = fields[0];

    return year;
}